

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O3

void __thiscall
ddd::DaTrie<false,_true,_true>::DaTrie
          (DaTrie<false,_true,_true> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  pointer pBVar1;
  pointer ppcVar2;
  pointer ppcVar3;
  Query query;
  Query local_50;
  vector<ddd::Block,_std::allocator<ddd::Block>_> *local_38;
  
  local_38 = &this->blocks_;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->node_links_).super__Vector_base<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blocks_).super__Vector_base<ddd::Block,_std::allocator<ddd::Block>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->tail_).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  this->head_pos_ = 0xffffffff;
  this->bc_emps_ = 0;
  this->tail_emps_ = 0;
  fix_(this,0,local_38);
  *(undefined4 *)
   (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.super__Vector_impl_data
   ._M_start = 0x7fffffff;
  pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
           super__Vector_impl_data._M_start;
  *pBVar1 = (Bc)((ulong)*pBVar1 | 0x7fffffff00000000);
  ppcVar3 = (prefixes->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppcVar2 = (prefixes->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppcVar3 != ppcVar2) {
    do {
      local_50.key_ = *ppcVar3;
      local_50.pos_ = 0;
      local_50.value_ = 0x7fffffff;
      local_50.node_pos_ = 0;
      local_50.is_finished_ = false;
      search_prefix(this,&local_50);
      if (local_50.key_[local_50._8_8_ & 0xffffffff] != '\0') {
        if ((~*(uint *)((this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                        super__Vector_impl_data._M_start + local_50.node_pos_) & 0x7fffffff) != 0) {
          insert_edge_(this,&local_50);
        }
        while (local_50.key_[local_50._8_8_ & 0xffffffff] != '\0') {
          append_edge_(this,&local_50);
        }
        pBVar1 = (this->bc_).super__Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_>._M_impl.
                 super__Vector_impl_data._M_start;
        pBVar1[local_50.node_pos_] =
             (Bc)((ulong)pBVar1[local_50.node_pos_] & 0xffffffff00000000 | 0x7fffffff);
      }
      ppcVar3 = ppcVar3 + 1;
    } while (ppcVar3 != ppcVar2);
  }
  return;
}

Assistant:

DaTrie(const std::vector<const char*>& prefixes) {
    assert(Prefix);

    fix_(ROOT_POS, blocks_);
    bc_[ROOT_POS].set_base(INVALID_VALUE);
    bc_[ROOT_POS].set_check(INVALID_VALUE);

    for (auto prefix : prefixes) {
      Query query(prefix);
      search_prefix(query);
      if (*query.key() == '\0') {
        continue;
      }
      if (bc_[query.node_pos()].base() != INVALID_VALUE) {
        insert_edge_(query);
      }
      while (*query.key() != '\0') {
        append_edge_(query);
      }
      bc_[query.node_pos()].set_base(INVALID_VALUE);
    }
  }